

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O3

int display_schema(void)

{
  int iVar1;
  cfg_db *db;
  autobuf log;
  autobuf aStack_38;
  
  abuf_init(&aStack_38);
  db = oonf_cfg_get_rawdb();
  iVar1 = cfg_cmd_handle_schema(db,_schema_name,&aStack_38);
  if (aStack_38._len != 0) {
    fputs(aStack_38._buf,_stdout);
  }
  abuf_free(&aStack_38);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int
display_schema(void) {
  struct autobuf log;
  int return_code;

  return_code = 0;

  abuf_init(&log);

  if (cfg_cmd_handle_schema(oonf_cfg_get_rawdb(), _schema_name, &log)) {
    return_code = -1;
  }

  if (abuf_getlen(&log) > 0) {
    fputs(abuf_getptr(&log), stdout);
  }

  abuf_free(&log);

  return return_code;
}